

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O2

void __thiscall iu_AssertionTest_x_iutest_x_LT_Test::Body(iu_AssertionTest_x_iutest_x_LT_Test *this)

{
  double *in_R9;
  float f1;
  float f0;
  AssertionResult iutest_ar;
  double d1;
  double d0;
  int x1;
  int x0;
  float local_208;
  char local_204 [4];
  AssertionResult local_200;
  iuCodeMessage local_1d8;
  double local_1a8;
  char local_1a0 [8];
  int local_198;
  char local_194 [4];
  Fixed local_190;
  
  local_194[0] = '\0';
  local_194[1] = '\0';
  local_194[2] = '\0';
  local_194[3] = '\0';
  local_204[0] = '\0';
  local_204[1] = '\0';
  local_204[2] = '\0';
  local_204[3] = '\0';
  local_1a0[0] = '\0';
  local_1a0[1] = '\0';
  local_1a0[2] = '\0';
  local_1a0[3] = '\0';
  local_1a0[4] = '\0';
  local_1a0[5] = '\0';
  local_1a0[6] = '\0';
  local_1a0[7] = '\0';
  local_198 = 1;
  local_208 = 1.0;
  local_1a8 = 1.0;
  iutest::internal::CmpHelperLT<int,int>
            (&local_200,(internal *)"x0","x1",local_194,&local_198,(int *)in_R9);
  if (local_200.m_result == false) {
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x93,local_200.m_message._M_dataplus._M_p);
    local_1d8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
  }
  else {
    std::__cxx11::string::~string((string *)&local_200);
    iutest::internal::CmpHelperLT<double,double>
              (&local_200,(internal *)"d0","d1",local_1a0,&local_1a8,in_R9);
    if (local_200.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x94,local_200.m_message._M_dataplus._M_p);
      local_1d8._44_4_ = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
      std::__cxx11::string::~string((string *)&local_1d8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_200);
    local_190.super_Message.m_stream.super_iu_stringstream._0_8_ = 0;
    local_1d8.m_message._M_dataplus._M_p._0_4_ = 1;
    iutest::internal::CmpHelperLT<double,int>
              (&local_200,(internal *)"0.0","0x1",(char *)&local_190,(double *)&local_1d8,
               (int *)in_R9);
    if (local_200.m_result == false) {
      memset(&local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
      iutest::detail::iuCodeMessage::iuCodeMessage
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
                 ,0x95,local_200.m_message._M_dataplus._M_p);
      local_1d8._44_4_ = 0xffffffff;
      iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
      std::__cxx11::string::~string((string *)&local_1d8);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)&local_190);
    }
    std::__cxx11::string::~string((string *)&local_200);
    iutest::internal::CmpHelperLT<float,float>
              (&local_200,(internal *)0x30caa2,"f1",local_204,&local_208,(float *)in_R9);
    if (local_200.m_result != false) goto LAB_00259d9f;
    memset(&local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1d8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/assertion_tests.cpp"
               ,0x96,local_200.m_message._M_dataplus._M_p);
    local_1d8._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1d8,&local_190);
  }
  std::__cxx11::string::~string((string *)&local_1d8);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
LAB_00259d9f:
  std::__cxx11::string::~string((string *)&local_200);
  return;
}

Assistant:

IUTEST(AssertionTest, LT)
{
    int x0=0, x1=1;
    float f0=0.0f, f1=1.0f;
    double d0=0.0, d1=1.0;
    IUTEST_ASSERT_LT(x0, x1);
    IUTEST_EXPECT_LT(d0, d1);
    IUTEST_INFORM_LT(0.0, 0x1);
    IUTEST_ASSERT_LT(f0, f1);
}